

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkPrint256(void)

{
  uint uVar1;
  undefined8 in_RAX;
  FILE *__stream;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  __stream = fopen("4varfs.txt","w");
  uVar1 = 1;
  while (uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38), uVar1 < 0xffff) {
    fwrite("read_truth ",0xb,1,__stream);
    Extra_PrintBinary((FILE *)__stream,(uint *)((long)&uStack_38 + 4),0x10);
    fwrite("; clp; st; w 1.blif; map; cec 1.blif\n",0x25,1,__stream);
    uVar1 = uStack_38._4_4_ + 1;
  }
  fclose(__stream);
  return;
}

Assistant:

void Abc_NtkPrint256()
{
    FILE * pFile;
    unsigned i;
    pFile = fopen( "4varfs.txt", "w" );
    for ( i = 1; i < (1<<16)-1; i++ )
    {
        fprintf( pFile, "read_truth " );
        Extra_PrintBinary( pFile, &i, 16 );
        fprintf( pFile, "; clp; st; w 1.blif; map; cec 1.blif\n" );
    }
    fclose( pFile );
}